

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int session_set_handle_max(SESSION_HANDLE session,handle handle_max)

{
  SESSION_INSTANCE *session_instance;
  int result;
  handle handle_max_local;
  SESSION_HANDLE session_local;
  
  if (session == (SESSION_HANDLE)0x0) {
    session_instance._0_4_ = 0x425;
  }
  else {
    session->handle_max = handle_max;
    session_instance._0_4_ = 0;
  }
  return (int)session_instance;
}

Assistant:

int session_set_handle_max(SESSION_HANDLE session, handle handle_max)
{
    int result;

    if (session == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)session;

        session_instance->handle_max = handle_max;

        result = 0;
    }

    return result;
}